

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engine.cpp
# Opt level: O2

void __thiscall Engine::clearPropState(Engine *this)

{
  uint uVar1;
  IntVar **ppIVar2;
  IntVar *pIVar3;
  vec<Propagator_*> *pvVar4;
  uint i;
  ulong uVar5;
  uint j;
  int i_1;
  long lVar6;
  
  uVar1 = (this->v_queue).sz;
  ppIVar2 = (this->v_queue).data;
  for (uVar5 = 0; uVar1 != uVar5; uVar5 = uVar5 + 1) {
    pIVar3 = ppIVar2[uVar5];
    pIVar3->changes = 0;
    pIVar3->in_queue = false;
  }
  if (ppIVar2 != (IntVar **)0x0) {
    (this->v_queue).sz = 0;
  }
  for (lVar6 = 0; lVar6 != 6; lVar6 = lVar6 + 1) {
    uVar5 = 0;
    while( true ) {
      pvVar4 = (this->p_queue).data;
      if (pvVar4[lVar6].sz <= uVar5) break;
      (*pvVar4[lVar6].data[uVar5]->_vptr_Propagator[4])();
      uVar5 = uVar5 + 1;
    }
    if (pvVar4[lVar6].data != (Propagator **)0x0) {
      pvVar4[lVar6].sz = 0;
    }
  }
  return;
}

Assistant:

void Engine::clearPropState() {
	for (unsigned int i = 0; i < v_queue.size(); i++) {
		v_queue[i]->clearPropState();
	}
	v_queue.clear();

	for (int i = 0; i < num_queues; i++) {
		for (unsigned int j = 0; j < p_queue[i].size(); j++) {
			p_queue[i][j]->clearPropState();
		}
		p_queue[i].clear();
	}
}